

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O0

void __thiscall
pele::physics::turbinflow::TurbInflow::add_turb
          (TurbInflow *this,Box *bx,FArrayBox *data,int dcomp,Geometry *geom,Real time,int dir,
          Side *side)

{
  Box *pBVar1;
  IntVect *pIVar2;
  long lVar3;
  Long LVar4;
  TurbParm *pTVar5;
  Real *pRVar6;
  double *pdVar7;
  Vector<double,_std::allocator<double>_> *x_00;
  int *in_RSI;
  Geometry *in_R8;
  int in_R9D;
  Arena *in_XMM0_Qa;
  Real RVar8;
  double dVar9;
  Real RVar10;
  double dVar11;
  Side *in_stack_00000008;
  Real z;
  int j;
  int i;
  Vector<double,_std::allocator<double>_> y;
  Vector<double,_std::allocator<double>_> x;
  int n;
  FArrayBox v;
  Box turbBox;
  IntVect hi;
  IntVect lo;
  int tr2Hi;
  int tr2Lo;
  int tr1Hi;
  int tr1Lo;
  int tdir2;
  int tdir1;
  int planeLoc;
  Box bvalsBox;
  Arena *in_stack_fffffffffffffcd8;
  Box *in_stack_fffffffffffffce0;
  Box *in_stack_fffffffffffffce8;
  FArrayBox *in_stack_fffffffffffffcf0;
  double *in_stack_fffffffffffffcf8;
  BaseFab<double> *in_stack_fffffffffffffd00;
  int local_288;
  int local_284;
  int local_26c;
  int local_268;
  int in_stack_fffffffffffffe0c;
  FArrayBox *in_stack_fffffffffffffe10;
  FArrayBox *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe28;
  int normDir;
  Box local_180;
  IntVect local_164;
  IntVect local_158;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  uint local_138;
  int local_134;
  Box local_130;
  int local_114;
  Arena *local_110;
  Geometry *local_108;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  IntVect *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar12;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar13;
  
  local_130.smallend.vect._0_8_ = *(undefined8 *)in_RSI;
  local_130.smallend.vect[2] = in_RSI[2];
  local_130.bigend.vect[0] = in_RSI[3];
  local_130.bigend.vect._4_8_ = *(undefined8 *)(in_RSI + 4);
  local_130.btype.itype = in_RSI[6];
  local_114 = in_R9D;
  local_110 = in_XMM0_Qa;
  local_108 = in_R8;
  if (*in_stack_00000008 == low) {
    pBVar1 = amrex::Geometry::Domain(in_R8);
    pIVar2 = amrex::Box::smallEnd(pBVar1);
    local_284 = pIVar2->vect[local_114] + -1;
  }
  else {
    pBVar1 = amrex::Geometry::Domain(in_R8);
    pIVar2 = amrex::Box::bigEnd(pBVar1);
    local_284 = pIVar2->vect[local_114] + 1;
  }
  local_134 = local_284;
  amrex::Box::setSmall(&local_130,local_114,local_284);
  amrex::Box::setBig(&local_130,local_114,local_134);
  local_138 = (uint)(local_114 == 0);
  if (local_114 == 0) {
    local_288 = 2;
  }
  else {
    local_288 = 2;
    if (local_114 == 2) {
      local_288 = 1;
    }
  }
  local_13c = local_288;
  pIVar2 = amrex::Box::smallEnd(&local_130);
  local_140 = pIVar2->vect[(int)local_138];
  pIVar2 = amrex::Box::bigEnd(&local_130);
  local_144 = pIVar2->vect[(int)local_138];
  pIVar2 = amrex::Box::smallEnd(&local_130);
  local_148 = pIVar2->vect[local_13c];
  pIVar2 = amrex::Box::bigEnd(&local_130);
  local_14c = pIVar2->vect[local_13c];
  amrex::IntVect::IntVect(&local_158,local_140,local_148,local_134);
  amrex::IntVect::IntVect(&local_164,local_144,local_14c,local_134);
  amrex::Box::Box(in_stack_fffffffffffffce0,(IntVect *)in_stack_fffffffffffffcd8,
                  (IntVect *)0x10d6ab7);
  amrex::The_Async_Arena();
  amrex::FArrayBox::FArrayBox
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),in_stack_fffffffffffffcd8);
  amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  for (normDir = 0; lVar3 = (long)normDir,
      LVar4 = amrex::
              Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
              ::size((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                      *)0x10d6b22), lVar3 < LVar4; normDir = normDir + 1) {
    pTVar5 = amrex::
             Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
             ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                           *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
    if ((pTVar5->dir == local_114) &&
       (pTVar5 = amrex::
                 Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8),
       pTVar5->side == *in_stack_00000008)) {
      amrex::Box::size(in_stack_fffffffffffffce8);
      std::allocator<double>::allocator((allocator<double> *)0x10d6c0f);
      amrex::Vector<double,_std::allocator<double>_>::vector
                ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffce0,
                 (size_type)in_stack_fffffffffffffcd8,(allocator_type *)0x10d6c2c);
      std::allocator<double>::~allocator((allocator<double> *)0x10d6c3b);
      amrex::Box::size(in_stack_fffffffffffffce8);
      std::allocator<double>::allocator((allocator<double> *)0x10d6cbe);
      amrex::Vector<double,_std::allocator<double>_>::vector
                ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffce0,
                 (size_type)in_stack_fffffffffffffcd8,(allocator_type *)0x10d6cd8);
      std::allocator<double>::~allocator((allocator<double> *)0x10d6ce7);
      pIVar2 = amrex::Box::smallEnd(&local_180);
      for (local_268 = pIVar2->vect[0]; pIVar2 = amrex::Box::bigEnd(&local_180),
          local_268 <= pIVar2->vect[0]; local_268 = local_268 + 1) {
        pRVar6 = amrex::Geometry::ProbLo((Geometry *)0x10d6d79);
        dVar9 = pRVar6[(int)local_138];
        RVar8 = amrex::CoordSys::CellSize(&local_108->super_CoordSys,local_138);
        pTVar5 = amrex::
                 Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
        dVar11 = pTVar5->turb_scale_loc;
        amrex::Box::smallEnd(&local_180);
        pdVar7 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffce0,
                            (size_type)in_stack_fffffffffffffcd8);
        *pdVar7 = (((double)local_268 + 0.5) * RVar8 + dVar9) * dVar11;
      }
      pIVar2 = amrex::Box::smallEnd(&local_180);
      uVar13 = 1;
      local_26c = pIVar2->vect[1];
      while( true ) {
        x_00 = (Vector<double,_std::allocator<double>_> *)amrex::Box::bigEnd(&local_180);
        uVar12 = 1;
        if (*(int *)((long)&(x_00->super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 4) < local_26c) break;
        pRVar6 = amrex::Geometry::ProbLo((Geometry *)0x10d6f54);
        RVar8 = pRVar6[local_13c];
        dVar9 = (double)local_26c + 0.5;
        RVar10 = amrex::CoordSys::CellSize(&local_108->super_CoordSys,local_13c);
        dVar11 = dVar9 * RVar10 + RVar8;
        pTVar5 = amrex::
                 Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                               *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
        dVar9 = pTVar5->turb_scale_loc;
        in_stack_ffffffffffffff28 = amrex::Box::smallEnd(&local_180);
        in_stack_ffffffffffffff24 = 1;
        pdVar7 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffce0,
                            (size_type)in_stack_fffffffffffffcd8);
        *pdVar7 = dVar11 * dVar9;
        local_26c = local_26c + 1;
      }
      in_stack_fffffffffffffcd8 = local_110;
      pTVar5 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffffce0,(size_type)local_110);
      in_stack_fffffffffffffce0 = (Box *)((double)in_stack_fffffffffffffcd8 + pTVar5->time_shift);
      pTVar5 = amrex::
               Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffce8 = (Box *)((double)in_stack_fffffffffffffce0 * pTVar5->turb_conv_vel)
      ;
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
      amrex::
      Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
      ::operator[]((Vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
      fill_turb_plane((TurbParm *)CONCAT44(uVar13,in_stack_ffffffffffffff40),x_00,
                      (Vector<double,_std::allocator<double>_> *)
                      CONCAT44(uVar12,in_stack_ffffffffffffff30),(Real)in_stack_ffffffffffffff28,
                      (FArrayBox *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      amrex::Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0x10d7135);
      amrex::Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0x10d7142);
    }
  }
  set_turb(normDir,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
           in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
  amrex::FArrayBox::~FArrayBox((FArrayBox *)0x10d71cd);
  return;
}

Assistant:

void
TurbInflow::add_turb(
  amrex::Box const& bx,
  amrex::FArrayBox& data,
  const int dcomp,
  amrex::Geometry const& geom,
  const amrex::Real time,
  const int dir,
  const amrex::Orientation::Side& side)
{
  AMREX_ASSERT(turbinflow_initialized);

  // Box on which we will access data
  amrex::Box bvalsBox = bx;
  int planeLoc =
    (side == amrex::Orientation::low ? geom.Domain().smallEnd()[dir] - 1
                                     : geom.Domain().bigEnd()[dir] + 1);
  bvalsBox.setSmall(dir, planeLoc);
  bvalsBox.setBig(dir, planeLoc);

  // Define box that we will fill with turb: need to be z-normal
  // Get transverse directions
  int tdir1 = (dir != 0) ? 0 : 1;
  int tdir2 = (dir != 0) ? ((dir == 2) ? 1 : 2) : 2;
  int tr1Lo = bvalsBox.smallEnd()[tdir1];
  int tr1Hi = bvalsBox.bigEnd()[tdir1];
  int tr2Lo = bvalsBox.smallEnd()[tdir2];
  int tr2Hi = bvalsBox.bigEnd()[tdir2];
  const amrex::IntVect lo(AMREX_D_DECL(tr1Lo, tr2Lo, planeLoc));
  const amrex::IntVect hi(AMREX_D_DECL(tr1Hi, tr2Hi, planeLoc));
  amrex::Box turbBox(lo, hi);
  amrex::FArrayBox v(turbBox, 3, amrex::The_Async_Arena());
  v.setVal<amrex::RunOn::Device>(0);

  // Add turbulence from all the tp acting on this face
  for (int n = 0; n < tp.size(); n++) {

    if (tp[n].dir == dir && tp[n].side == side) {

      // 0 and 1 are the two transverse directions
      amrex::Vector<amrex::Real> x(turbBox.size()[0]), y(turbBox.size()[1]);
      for (int i = turbBox.smallEnd()[0]; i <= turbBox.bigEnd()[0]; ++i) {
        x[i - turbBox.smallEnd()[0]] =
          (geom.ProbLo()[tdir1] + (i + 0.5) * geom.CellSize(tdir1)) *
          tp[n].turb_scale_loc;
      }
      for (int j = turbBox.smallEnd()[1]; j <= turbBox.bigEnd()[1]; ++j) {
        y[j - turbBox.smallEnd()[1]] =
          (geom.ProbLo()[tdir2] + (j + 0.5) * geom.CellSize(tdir2)) *
          tp[n].turb_scale_loc;
      }

      // Get the turbulence
      amrex::Real z =
        (time + tp[n].time_shift) * tp[n].turb_conv_vel * tp[n].turb_scale_loc;
      fill_turb_plane(tp[n], x, y, z, v);
    }
  }

  // Moving it into data
  set_turb(dir, tdir1, tdir2, v, data, dcomp);

#if 0
  std::string junk = "TurbV_AftTP"+std::to_string(n)+"_D";
  std::ofstream os;
  os.precision(15);
  os.open(junk.c_str());
  data.writeOn(os);
  os.close();
  amrex::Abort();
#endif
}